

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_rd.h
# Opt level: O2

int64_t calculate_sse(MACROBLOCKD *xd,macroblock_plane *p,macroblockd_plane *pd,int bw,int bh)

{
  int iVar1;
  _func_int64_t_uint8_t_ptr_int_uint8_t_ptr_int_int_int **pp_Var2;
  int64_t iVar3;
  byte bVar4;
  
  iVar1 = xd->bd;
  if ((xd->cur_buf->flags & 8) == 0) {
    pp_Var2 = &aom_sse;
  }
  else {
    pp_Var2 = &aom_highbd_sse;
  }
  iVar3 = (**pp_Var2)((p->src).buf,(p->src).stride,(pd->dst).buf,(pd->dst).stride,bw,bh);
  bVar4 = (char)iVar1 * '\x02' - 0x10;
  return (long)(iVar3 + (ulong)((uint)(1 << (bVar4 & 0x1f)) >> 1)) >> (bVar4 & 0x3f);
}

Assistant:

static int64_t calculate_sse(MACROBLOCKD *const xd,
                             const struct macroblock_plane *p,
                             struct macroblockd_plane *pd, const int bw,
                             const int bh) {
  int64_t sse = 0;
  const int shift = xd->bd - 8;
#if CONFIG_AV1_HIGHBITDEPTH
  if (is_cur_buf_hbd(xd)) {
    sse = aom_highbd_sse(p->src.buf, p->src.stride, pd->dst.buf, pd->dst.stride,
                         bw, bh);
  } else {
    sse =
        aom_sse(p->src.buf, p->src.stride, pd->dst.buf, pd->dst.stride, bw, bh);
  }
#else
  sse = aom_sse(p->src.buf, p->src.stride, pd->dst.buf, pd->dst.stride, bw, bh);
#endif
  sse = ROUND_POWER_OF_TWO(sse, shift * 2);
  return sse;
}